

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalysisScopeVisitor.h
# Opt level: O1

void __thiscall
slang::analysis::AnalysisScopeVisitor::visit(AnalysisScopeVisitor *this,ClassType *symbol)

{
  pointer *ppPVar1;
  AnalyzedScope *pAVar2;
  AnalysisManager *this_00;
  iterator __position;
  Scope *scope;
  PendingAnalysis local_28;
  
  pAVar2 = this->result;
  this_00 = this->manager;
  scope = getAsScope((Symbol *)symbol);
  AnalysisManager::analyzeScopeAsync(this_00,scope);
  __position._M_current =
       (pAVar2->childScopes).
       super__Vector_base<slang::analysis::PendingAnalysis,_std::allocator<slang::analysis::PendingAnalysis>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (pAVar2->childScopes).
      super__Vector_base<slang::analysis::PendingAnalysis,_std::allocator<slang::analysis::PendingAnalysis>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_28.symbol.ptr = (Symbol *)symbol;
    local_28.analysisManager.ptr = this_00;
    std::vector<slang::analysis::PendingAnalysis,_std::allocator<slang::analysis::PendingAnalysis>_>
    ::_M_realloc_insert<slang::analysis::PendingAnalysis>(&pAVar2->childScopes,__position,&local_28)
    ;
  }
  else {
    ((__position._M_current)->symbol).ptr = (Symbol *)symbol;
    ((__position._M_current)->analysisManager).ptr = this_00;
    ppPVar1 = &(pAVar2->childScopes).
               super__Vector_base<slang::analysis::PendingAnalysis,_std::allocator<slang::analysis::PendingAnalysis>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppPVar1 = *ppPVar1 + 1;
  }
  return;
}

Assistant:

void visit(const ClassType& symbol) {
        result.childScopes.emplace_back(manager.analyzeSymbol(symbol));
    }